

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PArena.cpp
# Opt level: O2

bool __thiscall amrex::PArena::isManaged(PArena *this)

{
  return false;
}

Assistant:

bool
PArena::isManaged () const
{
#ifdef AMREX_USE_GPU
#ifdef AMREX_CUDA_GE_11_2
    if (Gpu::Device::memoryPoolsSupported()) {
        return false; // cudaMallocAsync allocates device memory
    } else
#endif
    {
        return The_Arena()->isManaged();
    }
#else
    return false;
#endif
}